

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

bool __thiscall doublechecked::Roaring::containsRange(Roaring *this,uint64_t x,uint64_t y)

{
  _Bool _Var1;
  _Rb_tree_node_base *p_Var2;
  int line;
  _Rb_tree_node_base *p_Var3;
  char *expression;
  unsigned_long result;
  _Rb_tree_color _Var4;
  uint64_t uVar5;
  _Rb_tree_header *p_Var6;
  bool bVar7;
  
  _Var1 = roaring_bitmap_contains_range((roaring_bitmap_t *)this,x,y);
  p_Var6 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  _Var4 = (_Rb_tree_color)x;
  p_Var2 = (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var6->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar7]) {
    bVar7 = p_Var2[1]._M_color < _Var4;
    if (!bVar7) {
      p_Var3 = p_Var2;
    }
  }
  p_Var2 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var6) && (p_Var2 = p_Var3, _Var4 < p_Var3[1]._M_color)) {
    p_Var2 = &p_Var6->_M_header;
  }
  if (x < y) {
    if ((_Rb_tree_header *)p_Var2 == p_Var6) {
      result = (unsigned_long)!_Var1;
      expression = "ans == false";
      line = 0xb8;
    }
    else {
      do {
        uVar5 = x;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        if (((_Rb_tree_header *)p_Var2 == p_Var6) ||
           (x = (uint64_t)p_Var2[1]._M_color, uVar5 + 1 != x)) break;
      } while (x < y);
      result = (unsigned_long)(_Var1 != (uVar5 != y - 1));
      expression = "ans == (last == y - 1)";
      line = 0xbd;
    }
  }
  else {
    result = (unsigned_long)_Var1;
    expression = "ans == true";
    line = 0xb6;
  }
  _assert_true(result,expression,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,line);
  return _Var1;
}

Assistant:

bool containsRange(const uint64_t x, const uint64_t y) const {
        bool ans = plain.containsRange(x, y);

        auto it = check.find(x);
        if (x >= y)
            assert_true(ans == true);  // roaring says true for this
        else if (it == check.end())
            assert_true(ans == false);  // start of range not in set
        else {
            uint64_t last = x;  // iterate up to y so long as values sequential
            while (++it != check.end() && last + 1 == *it && *it < y)
                last = *it;
            assert_true(ans == (last == y - 1));
        }

        return ans;
    }